

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O1

bool __thiscall
cmIfCommand::InvokeInitialPass
          (cmIfCommand *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  bool bVar1;
  cmFunctionBlocker *fb;
  MessageType status;
  string errorString;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_9c;
  string local_98;
  string local_78;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_58;
  cmConditionEvaluator local_40;
  
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_58.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&local_58,(char *)0x0);
  cmConditionEvaluator::cmConditionEvaluator(&local_40,(this->super_cmCommand).Makefile);
  bVar1 = cmConditionEvaluator::IsTrue(&local_40,&local_58,&local_98,&local_9c);
  if (local_98._M_string_length != 0) {
    cmIfCommandError_abi_cxx11_(&local_78,&local_58);
    std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
    if (local_9c == FATAL_ERROR) {
      cmCommand::SetError(&this->super_cmCommand,&local_78);
      cmSystemTools::s_FatalErrorOccured = true;
    }
    else {
      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,local_9c,&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_9c == FATAL_ERROR) {
      bVar1 = false;
      goto LAB_0029e5a7;
    }
  }
  fb = (cmFunctionBlocker *)operator_new(0x88);
  (fb->StartingContext).Name._M_dataplus._M_p = (pointer)&(fb->StartingContext).Name.field_2;
  (fb->StartingContext).Name._M_string_length = 0;
  (fb->StartingContext).Name.field_2._M_local_buf[0] = '\0';
  (fb->StartingContext).FilePath._M_dataplus._M_p = (pointer)&(fb->StartingContext).FilePath.field_2
  ;
  (fb->StartingContext).FilePath._M_string_length = 0;
  (fb->StartingContext).FilePath.field_2._M_local_buf[0] = '\0';
  (fb->StartingContext).Line = 0;
  fb->_vptr_cmFunctionBlocker = (_func_int **)&PTR_IsFunctionBlocked_005b2660;
  *(undefined1 *)((long)&fb[1].StartingContext.FilePath._M_string_length + 1) = 0;
  fb[1]._vptr_cmFunctionBlocker = (_func_int **)0x0;
  fb[1].StartingContext.Name._M_dataplus._M_p = (pointer)0x0;
  fb[1].StartingContext.Name._M_string_length = 0;
  fb[1].StartingContext.Name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&fb[1].StartingContext.Name.field_2 + 8) = 0;
  fb[1].StartingContext.FilePath._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)((long)&fb[1].StartingContext.FilePath._M_string_length + 4) = 1;
  *(bool *)&fb[1].StartingContext.FilePath._M_string_length = !bVar1;
  if (bVar1) {
    *(undefined1 *)((long)&fb[1].StartingContext.FilePath._M_string_length + 1) = 1;
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)(fb + 1),args);
  bVar1 = true;
  cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,fb);
LAB_0029e5a7:
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            (&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool cmIfCommand
::InvokeInitialPass(const std::vector<cmListFileArgument>& args,
                    cmExecutionStatus &)
{
  std::string errorString;

  std::vector<cmExpandedCommandArgument> expandedArguments;
  this->Makefile->ExpandArguments(args, expandedArguments);

  cmake::MessageType status;

  cmConditionEvaluator conditionEvaluator(*(this->Makefile));

  bool isTrue = conditionEvaluator.IsTrue(
    expandedArguments, errorString, status);

  if (!errorString.empty())
    {
    std::string err = cmIfCommandError(expandedArguments);
    err += errorString;
    if (status == cmake::FATAL_ERROR)
      {
      this->SetError(err);
      cmSystemTools::SetFatalErrorOccured();
      return false;
      }
    else
      {
      this->Makefile->IssueMessage(status, err);
      }
    }

  cmIfFunctionBlocker *f = new cmIfFunctionBlocker();
  // if is isn't true block the commands
  f->ScopeDepth = 1;
  f->IsBlocking = !isTrue;
  if (isTrue)
    {
    f->HasRun = true;
    }
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}